

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::Cues::Size(Cues *this)

{
  CuePoint *this_00;
  uint64_t uVar1;
  uint64 uVar2;
  int local_1c;
  uint64 uStack_18;
  int32_t i;
  uint64_t size;
  Cues *this_local;
  
  uStack_18 = 0;
  for (local_1c = 0; local_1c < this->cue_entries_size_; local_1c = local_1c + 1) {
    this_00 = GetCueByIndex(this,local_1c);
    uVar1 = CuePoint::Size(this_00);
    uStack_18 = uVar1 + uStack_18;
  }
  uVar2 = EbmlMasterElementSize(0x1c53bb6b,uStack_18);
  return uVar2 + uStack_18;
}

Assistant:

uint64_t Cues::Size() {
  uint64_t size = 0;
  for (int32_t i = 0; i < cue_entries_size_; ++i)
    size += GetCueByIndex(i)->Size();
  size += EbmlMasterElementSize(libwebm::kMkvCues, size);
  return size;
}